

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O2

void __thiscall perf::suite::run(suite *this)

{
  pointer ppVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  vector<perf::perf_case,_std::allocator<perf::perf_case>_> *__range2;
  pointer this_00;
  
  (this->m_total_time).__r = 0;
  ppVar1 = (this->m_cases).super__Vector_base<perf::perf_case,_std::allocator<perf::perf_case>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_cases).
                 super__Vector_base<perf::perf_case,_std::allocator<perf::perf_case>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != ppVar1; this_00 = this_00 + 1) {
    lVar3 = std::chrono::_V2::system_clock::now();
    bVar2 = std::function<bool_()>::operator()(&this_00->f);
    this_00->success = bVar2;
    lVar4 = std::chrono::_V2::system_clock::now();
    (this_00->time).__r = lVar4 - lVar3;
    (this->m_total_time).__r = (this->m_total_time).__r + (lVar4 - lVar3);
  }
  return;
}

Assistant:

void run()
        {
            clock clk;
            time_point time_start, time_stop;
            m_total_time = nanoseconds(0);

            for (auto &c : m_cases)
            {
                time_start = clk.now();
                try
                {
                    c.success = c.f();
                }
                catch (...)
                {
                    c.success = false;
                }
                time_stop = clk.now();
                c.time = time_stop - time_start;
                m_total_time += c.time;
            }
        }